

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framebuffer.hpp
# Opt level: O0

bool __thiscall qe::Framebuffer::valid(Framebuffer *this)

{
  GLenum GVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  Framebuffer *local_18;
  Framebuffer *this_local;
  
  local_18 = this;
  bind(this,in_ESI,in_RDX,in_ECX);
  GVar1 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cd5) {
    unbind();
    this_local._7_1_ = true;
  }
  else {
    GVar1 = (*glad_glCheckFramebufferStatus)(0x8d40);
    if (GVar1 == 0x8cd6) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar2 = std::operator<<(poVar2,"FBO.valid: Incomplete Attachment");
      poVar2 = std::operator<<(poVar2," (");
      cut_abi_cxx11_(&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar2 = std::operator<<(poVar2,(string *)&local_38);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4a);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else if (GVar1 == 0x8cd7) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar2 = std::operator<<(poVar2,"FBO.valid: No Attachments");
      poVar2 = std::operator<<(poVar2," (");
      cut_abi_cxx11_(&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar2 = std::operator<<(poVar2,(string *)&local_68);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4d);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else if (GVar1 == 0x8cdc) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar2 = std::operator<<(poVar2,"FBO.valid: Invalid readBuffer");
      poVar2 = std::operator<<(poVar2," (");
      cut_abi_cxx11_(&local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar2 = std::operator<<(poVar2,(string *)&local_88);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x50);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else if (GVar1 == 0x8d56) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar2 = std::operator<<(poVar2,"FBO.valid: Incomplete Multisample");
      poVar2 = std::operator<<(poVar2," (");
      cut_abi_cxx11_(&local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar2 = std::operator<<(poVar2,(string *)&local_a8);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x53);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else if (GVar1 == 0x8da8) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar2 = std::operator<<(poVar2,"FBO.valid: Incomplete Layer Targets");
      poVar2 = std::operator<<(poVar2," (");
      cut_abi_cxx11_(&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar2 = std::operator<<(poVar2,(string *)&local_c8);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x56);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool valid() {
            bind();
            if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
                switch(glCheckFramebufferStatus(GL_FRAMEBUFFER)) {
                case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT:
                    GERR("FBO.valid: Incomplete Attachment");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT:
                    GERR("FBO.valid: No Attachments");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER:
                    GERR("FBO.valid: Invalid readBuffer");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE:
                    GERR("FBO.valid: Incomplete Multisample");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS:
                    GERR("FBO.valid: Incomplete Layer Targets");
                    break;
                }
                return false;
            }
            unbind();
            return true;
        }